

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O2

int __thiscall smf::Binasc::outputStyleMidi(Binasc *this,ostream *out,istream *input)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  ostream *poVar5;
  uint uVar6;
  char *pcVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uchar ch;
  uchar byte2;
  uchar byte1;
  Binasc *local_1f8;
  uint local_1ec;
  uint local_1e8;
  int command;
  ostream *local_1e0;
  int trackbytes;
  stringstream tempout;
  long local_1a8 [3];
  uint auStack_190 [88];
  
  local_1f8 = this;
  local_1e0 = out;
  std::__cxx11::stringstream::stringstream((stringstream *)&tempout);
  std::istream::read((char *)input,(long)&ch);
  if (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) == 0) {
    if (ch == 'M') {
      std::istream::read((char *)input,(long)&ch);
      if (ch == 'T') {
        std::istream::read((char *)input,(long)&ch);
        if (ch == 'h') {
          std::istream::read((char *)input,(long)&ch);
          if (ch == 'd') {
            std::operator<<((ostream *)local_1a8,"\"MThd\"");
            if (local_1f8->m_commentsQ != 0) {
              std::operator<<((ostream *)local_1a8,"\t\t\t; MIDI header chunk marker");
            }
            std::endl<char,std::char_traits<char>>((ostream *)local_1a8);
            std::istream::read((char *)input,(long)&ch);
            uVar1 = ch;
            std::istream::read((char *)input,(long)&ch);
            uVar2 = ch;
            std::istream::read((char *)input,(long)&ch);
            uVar3 = ch;
            std::istream::read((char *)input,(long)&ch);
            uVar4 = ch;
            poVar5 = std::operator<<((ostream *)local_1a8,"4\'");
            uVar9 = ((uint)uVar2 << 8 | (uint)uVar1 << 0x10 | (uint)uVar3) << 8 | (uint)uVar4;
            std::ostream::operator<<(poVar5,uVar9);
            if (local_1f8->m_commentsQ != 0) {
              std::operator<<((ostream *)local_1a8,"\t\t\t; bytes to follow in header chunk");
            }
            std::endl<char,std::char_traits<char>>((ostream *)local_1a8);
            std::istream::read((char *)input,(long)&ch);
            uVar1 = ch;
            std::istream::read((char *)input,(long)&ch);
            uVar2 = ch;
            uVar10 = (ulong)ch;
            poVar5 = std::operator<<((ostream *)local_1a8,"2\'");
            uVar6 = (uint)CONCAT11(uVar1,uVar2);
            std::ostream::operator<<(poVar5,uVar6);
            if (local_1f8->m_commentsQ != 0) {
              poVar5 = std::operator<<((ostream *)local_1a8,"\t\t\t; file format: Type-");
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar6);
              std::operator<<(poVar5," (");
              if (uVar6 < 3) {
                pcVar7 = &DAT_00120ecc + *(int *)(&DAT_00120ecc + uVar10 * 4);
              }
              else {
                pcVar7 = "unknown";
              }
              std::operator<<((ostream *)local_1a8,pcVar7);
              std::operator<<((ostream *)local_1a8,")");
            }
            std::endl<char,std::char_traits<char>>((ostream *)local_1a8);
            std::istream::read((char *)input,(long)&ch);
            uVar1 = ch;
            std::istream::read((char *)input,(long)&ch);
            uVar2 = ch;
            poVar5 = std::operator<<((ostream *)local_1a8,"2\'");
            local_1e8 = (uint)CONCAT11(uVar1,uVar2);
            std::ostream::operator<<(poVar5,local_1e8);
            if (local_1f8->m_commentsQ != 0) {
              std::operator<<((ostream *)local_1a8,"\t\t\t; number of tracks");
            }
            std::endl<char,std::char_traits<char>>((ostream *)local_1a8);
            std::istream::read((char *)input,(long)&byte1);
            std::istream::read((char *)input,(long)&byte2);
            if ((char)byte1 < '\0') {
              poVar5 = std::operator<<((ostream *)local_1a8,"\'-");
              std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
              if (local_1f8->m_commentsQ != 0) {
                std::operator<<((ostream *)local_1a8,"\t\t\t; SMPTE frames/second");
              }
              std::endl<char,std::char_traits<char>>((ostream *)local_1a8);
              poVar5 = std::operator<<((ostream *)local_1a8,"\'");
              *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
                   *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
              std::ostream::_M_insert<long>((long)poVar5);
              if (local_1f8->m_commentsQ != 0) {
                std::operator<<((ostream *)local_1a8,"\t\t\t; subframes per frame");
              }
              std::endl<char,std::char_traits<char>>((ostream *)local_1a8);
            }
            else {
              poVar5 = std::operator<<((ostream *)local_1a8,"2\'");
              std::ostream::operator<<(poVar5,(int)CONCAT11(byte1,byte2));
              if (local_1f8->m_commentsQ != 0) {
                std::operator<<((ostream *)local_1a8,"\t\t\t; ticks per quarter note");
              }
              std::endl<char,std::char_traits<char>>((ostream *)local_1a8);
            }
            uVar6 = 6;
            if (6 < (int)uVar9) {
              uVar6 = uVar9;
            }
            for (iVar8 = 6 - uVar6; iVar8 != 0; iVar8 = iVar8 + 1) {
              std::istream::read((char *)input,(long)&ch);
              if (ch < 0x10) {
                std::operator<<((ostream *)local_1a8,'0');
              }
              *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                   *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
              std::ostream::operator<<(local_1a8,(uint)ch);
            }
            if (6 < (int)uVar9) {
              std::operator<<((ostream *)local_1a8,"\t\t\t; unknown header bytes");
              std::endl<char,std::char_traits<char>>((ostream *)local_1a8);
            }
            for (local_1ec = 0; local_1ec != local_1e8; local_1ec = local_1ec + 1) {
              poVar5 = std::operator<<((ostream *)local_1a8,"\n;;; TRACK ");
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1ec);
              poVar5 = std::operator<<(poVar5," ----------------------------------");
              std::endl<char,std::char_traits<char>>(poVar5);
              std::istream::read((char *)input,(long)&ch);
              if (ch != 'M') {
                pcVar7 = "Not a MIDI file M2";
LAB_0011ced1:
                poVar5 = std::operator<<((ostream *)&std::cerr,pcVar7);
                iVar8 = 0;
                std::endl<char,std::char_traits<char>>(poVar5);
                goto LAB_0011c9f4;
              }
              std::istream::read((char *)input,(long)&ch);
              if (ch != 'T') {
                pcVar7 = "Not a MIDI file T2";
                goto LAB_0011ced1;
              }
              std::istream::read((char *)input,(long)&ch);
              if (ch != 'r') {
                pcVar7 = "Not a MIDI file r";
                goto LAB_0011ced1;
              }
              std::istream::read((char *)input,(long)&ch);
              if (ch != 'k') {
                pcVar7 = "Not a MIDI file k";
                goto LAB_0011ced1;
              }
              std::operator<<((ostream *)local_1a8,"\"MTrk\"");
              if (local_1f8->m_commentsQ != 0) {
                std::operator<<((ostream *)local_1a8,"\t\t\t; MIDI track chunk marker");
              }
              std::endl<char,std::char_traits<char>>((ostream *)local_1a8);
              std::istream::read((char *)input,(long)&ch);
              uVar1 = ch;
              std::istream::read((char *)input,(long)&ch);
              uVar2 = ch;
              std::istream::read((char *)input,(long)&ch);
              uVar3 = ch;
              std::istream::read((char *)input,(long)&ch);
              uVar4 = ch;
              poVar5 = std::operator<<((ostream *)local_1a8,"4\'");
              uVar9 = ((uint)uVar2 << 8 | (uint)uVar1 << 0x10 | (uint)uVar3) << 8 | (uint)uVar4;
              std::ostream::operator<<(poVar5,uVar9);
              if (local_1f8->m_commentsQ != 0) {
                std::operator<<((ostream *)local_1a8,"\t\t\t; bytes to follow in track chunk");
              }
              std::endl<char,std::char_traits<char>>((ostream *)local_1a8);
              trackbytes = 0;
              command = 0;
              while( true ) {
                iVar8 = readMidiEvent(local_1f8,(ostream *)local_1a8,input,&trackbytes,&command);
                if (iVar8 == 0) break;
                std::operator<<((ostream *)local_1a8,"\n");
              }
              std::operator<<((ostream *)local_1a8,"\n");
              iVar8 = trackbytes;
              if (trackbytes != uVar9) {
                poVar5 = std::operator<<((ostream *)local_1a8,"; TRACK SIZE ERROR, ACTUAL SIZE: ");
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar8);
                std::endl<char,std::char_traits<char>>(poVar5);
              }
            }
            std::__cxx11::stringbuf::str();
            std::operator<<(local_1e0,(string *)&trackbytes);
            std::__cxx11::string::~string((string *)&trackbytes);
            iVar8 = 1;
            goto LAB_0011c9f4;
          }
          pcVar7 = "Not a MIDI file d";
        }
        else {
          pcVar7 = "Not a MIDI file h";
        }
      }
      else {
        pcVar7 = "Not a MIDI file T";
      }
    }
    else {
      pcVar7 = "Not a MIDI file M";
    }
  }
  else {
    pcVar7 = "End of the file right away!";
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,pcVar7);
  iVar8 = 0;
  std::endl<char,std::char_traits<char>>(poVar5);
LAB_0011c9f4:
  std::__cxx11::stringstream::~stringstream((stringstream *)&tempout);
  return iVar8;
}

Assistant:

int Binasc::outputStyleMidi(std::ostream& out, std::istream& input) {
	uchar ch;                      // current input byte
	std::stringstream tempout;
	input.read((char*)&ch, 1);

	if (input.eof()) {
		std::cerr << "End of the file right away!" << std::endl;
		return 0;
	}

	// Read the MIDI file header:

	// The first four bytes must be the characters "MThd"
	if (ch != 'M') { std::cerr << "Not a MIDI file M" << std::endl; return 0; }
	input.read((char*)&ch, 1);
	if (ch != 'T') { std::cerr << "Not a MIDI file T" << std::endl; return 0; }
	input.read((char*)&ch, 1);
	if (ch != 'h') { std::cerr << "Not a MIDI file h" << std::endl; return 0; }
	input.read((char*)&ch, 1);
	if (ch != 'd') { std::cerr << "Not a MIDI file d" << std::endl; return 0; }
	tempout << "\"MThd\"";
	if (m_commentsQ) {
		tempout << "\t\t\t; MIDI header chunk marker";
	}
	tempout << std::endl;

	// The next four bytes are a big-endian byte count for the header
	// which should nearly always be "6".
	int headersize = 0;
	input.read((char*)&ch, 1); headersize = (headersize << 8) | ch;
	input.read((char*)&ch, 1); headersize = (headersize << 8) | ch;
	input.read((char*)&ch, 1); headersize = (headersize << 8) | ch;
	input.read((char*)&ch, 1); headersize = (headersize << 8) | ch;
	tempout << "4'" << headersize;
	if (m_commentsQ) {
		tempout << "\t\t\t; bytes to follow in header chunk";
	}
	tempout << std::endl;

	// First number in header is two-byte file type.
	int filetype = 0;
	input.read((char*)&ch, 1);
	filetype = (filetype << 8) | ch;
	input.read((char*)&ch, 1);
	filetype = (filetype << 8) | ch;
	tempout << "2'" << filetype;
	if (m_commentsQ) {
		tempout << "\t\t\t; file format: Type-" << filetype << " (";
		switch (filetype) {
			case 0:  tempout << "single track"; break;
			case 1:  tempout << "multitrack";   break;
			case 2:  tempout << "multisegment"; break;
			default: tempout << "unknown";      break;
		}
		tempout << ")";
	}
	tempout << std::endl;

	// Second number in header is two-byte trackcount.
	int trackcount = 0;
	input.read((char*)&ch, 1);
	trackcount = (trackcount << 8) | ch;
	input.read((char*)&ch, 1);
	trackcount = (trackcount << 8) | ch;
	tempout << "2'" << trackcount;
	if (m_commentsQ) {
		tempout << "\t\t\t; number of tracks";
	}
	tempout << std::endl;

	// Third number is divisions.  This can be one of two types:
	// regular: top bit is 0: number of ticks per quarter note
	// SMPTE:   top bit is 1: first byte is negative frames, second is
	//          ticks per frame.
	uchar byte1;
	uchar byte2;
	input.read((char*)&byte1, 1);
	input.read((char*)&byte2, 1);
	if (byte1 & 0x80) {
		// SMPTE divisions
		tempout << "'-" << 0xff - (ulong)byte1 + 1;
		if (m_commentsQ) {
			tempout << "\t\t\t; SMPTE frames/second";
		}
		tempout << std::endl;
		tempout << "'" << std::dec << (long)byte2;
		if (m_commentsQ) {
			tempout << "\t\t\t; subframes per frame";
		}
		tempout << std::endl;
	} else {
		// regular divisions
		int divisions = 0;
		divisions = (divisions << 8) | byte1;
		divisions = (divisions << 8) | byte2;
		tempout << "2'" << divisions;
		if (m_commentsQ) {
			tempout << "\t\t\t; ticks per quarter note";
		}
		tempout << std::endl;
	}

	// Print any strange bytes in header:
	int i;
	for (i=0; i<headersize - 6; i++) {
		input.read((char*)&ch, 1);
		if (ch < 0x10) {
			tempout << '0';
		}
		tempout << std::hex << (int)ch;
	}
	if (headersize - 6 > 0) {
		tempout << "\t\t\t; unknown header bytes";
		tempout << std::endl;
	}

	for (i=0; i<trackcount; i++) {
		tempout << "\n;;; TRACK "
				  << i << " ----------------------------------" << std::endl;

		input.read((char*)&ch, 1);
		// The first four bytes of a track must be the characters "MTrk"
		if (ch != 'M') { std::cerr << "Not a MIDI file M2" << std::endl; return 0; }
		input.read((char*)&ch, 1);
		if (ch != 'T') { std::cerr << "Not a MIDI file T2" << std::endl; return 0; }
		input.read((char*)&ch, 1);
		if (ch != 'r') { std::cerr << "Not a MIDI file r" << std::endl; return 0; }
		input.read((char*)&ch, 1);
		if (ch != 'k') { std::cerr << "Not a MIDI file k" << std::endl; return 0; }
		tempout << "\"MTrk\"";
		if (m_commentsQ) {
			tempout << "\t\t\t; MIDI track chunk marker";
		}
		tempout << std::endl;

		// The next four bytes are a big-endian byte count for the track
		int tracksize = 0;
		input.read((char*)&ch, 1); tracksize = (tracksize << 8) | ch;
		input.read((char*)&ch, 1); tracksize = (tracksize << 8) | ch;
		input.read((char*)&ch, 1); tracksize = (tracksize << 8) | ch;
		input.read((char*)&ch, 1); tracksize = (tracksize << 8) | ch;
		tempout << "4'" << tracksize;
		if (m_commentsQ) {
			tempout << "\t\t\t; bytes to follow in track chunk";
		}
		tempout << std::endl;

		int trackbytes = 0;
		int command = 0;

		// process MIDI events until the end of the track
		while (readMidiEvent(tempout, input, trackbytes, command)) {
			tempout << "\n";
		};
		tempout << "\n";

		if (trackbytes != tracksize) {
			tempout << "; TRACK SIZE ERROR, ACTUAL SIZE: " << trackbytes << std::endl;
		}
	}

	// print #define definitions if requested.


	// print main content of MIDI file parsing:
	out << tempout.str();
	return 1;
}